

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::EquidistantDistortion::invTransform
          (EquidistantDistortion *this,double *xd,double *yd,double xx,double yy)

{
  double *in_RDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double dtmp [7];
  long ltmp [1];
  double fvec [1];
  EquidistantDistortionParameter param;
  double x [1];
  long *in_stack_00000100;
  double *in_stack_00000108;
  undefined1 local_a8 [64];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double *local_18;
  double *local_10;
  
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = sqrt(in_XMM0_Qa * in_XMM0_Qa + in_XMM1_Qa * in_XMM1_Qa);
  *local_10 = local_20;
  *local_18 = local_28;
  if (1e-09 < local_38) {
    local_58 = *(undefined8 *)(in_RDI + 8);
    local_50 = *(undefined8 *)(in_RDI + 0x10);
    local_48 = *(undefined8 *)(in_RDI + 0x18);
    local_40 = *(undefined8 *)(in_RDI + 0x20);
    local_30 = local_38;
    memset(local_68,0,8);
    memset(local_a8,0,0x38);
    slmdif((lmdifFct)this,xd._4_4_,(int)xd,yd,(double *)xx,(void *)yy,x[0],param.radius,
           in_stack_00000100,in_stack_00000108);
    *local_10 = (local_30 / local_38) * *local_10;
    *local_18 = (local_30 / local_38) * *local_18;
  }
  return;
}

Assistant:

void EquidistantDistortion::invTransform(double &xd, double &yd, double xx, double yy) const
{
  // equidistant distortion model

  double x[1]= { std::sqrt(xx*xx+yy*yy) };

  xd=xx;
  yd=yy;

  if (x[0] > 1e-9)
  {
    EquidistantDistortionParameter param;

    param.ed[0]=ed[0];
    param.ed[1]=ed[1];
    param.ed[2]=ed[2];
    param.ed[3]=ed[3];
    param.radius=x[0];

    double fvec[1];

    long ltmp[1]= {0};
    double dtmp[7];

    memset(dtmp, 0, 7*sizeof(double));
    gmath::slmdif(computeEquidistantDistortion, 1, 1, x, fvec, &param, 1e-6, 0, ltmp, dtmp);

    xd*=x[0]/param.radius;
    yd*=x[0]/param.radius;
  }
}